

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O2

void __thiscall
GF2::Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::_Update
          (Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *this,
          iterator posPoly)

{
  _CPs *this_00;
  _List_node_base *polyRight;
  _I *iRight;
  size_t *psVar1;
  bool bVar2;
  const_iterator __position;
  iterator iVar3;
  iterator __position_00;
  ulong i;
  _Self __tmp;
  iterator pos;
  _List_node_base *p_Var4;
  _CPs newpairs;
  CritPair<8UL,_GF2::MOGrevlex<8UL>_> newpair;
  _List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  local_80;
  value_type local_68;
  _CPs *local_38;
  
  this_00 = &this->_pairs;
  __position._M_node =
       (this->_pairs).
       super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  polyRight = posPoly._M_node + 1;
  while (__position._M_node != (_List_node_base *)this_00) {
    if ((((ulong)(((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&polyRight->_M_next)->
                 super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next & ~(ulong)__position._M_node[3]._M_prev)
         == 0) &&
       (((ulong)__position._M_node[3]._M_next & ~(ulong)__position._M_node[2]._M_next) != 0)) {
      __position._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ::erase(this_00,__position);
      psVar1 = &(this->_stat).a_criterion;
      *psVar1 = *psVar1 + 1;
    }
    else {
      __position._M_node = (__position._M_node)->_M_next;
    }
  }
  local_80._M_impl._M_node._M_size = 0;
  iRight = &this->_basis;
  pos._M_node = (this->_basis).
                super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                .
                super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
  local_80._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_80;
  local_38 = this_00;
LAB_001427d1:
  do {
    if (pos._M_node == (_List_node_base *)iRight) {
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::sort((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              *)&local_80);
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::merge(local_38,(list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)&local_80);
      for (i = 0; i != 8; i = i + 1) {
        if (((ulong)(((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&polyRight->_M_next)->
                    super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                    super__List_node_base._M_next[1]._M_next >> (i & 0x3f) & 1) != 0) {
          CritPair<8UL,_GF2::MOGrevlex<8UL>_>::CritPair(&local_68,i,(iterator)posPoly._M_node);
          std::__cxx11::
          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ::push_front((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)&local_80,&local_68);
        }
      }
      p_Var4 = (_List_node_base *)iRight;
LAB_001428d6:
      do {
        do {
          p_Var4 = p_Var4->_M_next;
          iVar3._M_node = local_80._M_impl._M_node.super__List_node_base._M_next;
          if (p_Var4 == (_List_node_base *)iRight) {
            while (iVar3._M_node != (_List_node_base *)&local_80) {
              bVar2 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRelPrime
                                ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)(iVar3._M_node + 1));
              if (bVar2) {
                psVar1 = &(this->_stat).buch_criterion;
                *psVar1 = *psVar1 + 1;
                iVar3 = std::__cxx11::
                        list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                                 *)&local_80,iVar3._M_node);
              }
              else {
                iVar3._M_node = (iVar3._M_node)->_M_next;
              }
            }
            std::__cxx11::
            list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
            ::sort((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    *)&local_80);
            std::__cxx11::
            list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
            ::merge(local_38,(list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                              *)&local_80);
            std::__cxx11::
            _List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
            ::_M_clear(&local_80);
            return;
          }
        } while (p_Var4 == posPoly._M_node);
        local_68.field_0.var1 = 0xffffffffffffffff;
        local_68.field_0.lm1.super_WW<8UL>._words[0] = (WW<8UL>)p_Var4[1]._M_next[1]._M_next;
        local_68.field_1.lm2.super_WW<8UL>._words[0] =
             (WW<8UL>)posPoly._M_node[1]._M_next[1]._M_next;
        local_68.lcm.super_WW<8UL>._words[0] =
             (WW<8UL>)((ulong)local_68.field_1.lm2.super_WW<8UL>._words[0] |
                      (ulong)local_68.field_0.lm1.super_WW<8UL>._words[0]);
        local_68.field_0.iter1._M_node = p_Var4;
        local_68.field_1.iter2._M_node = posPoly._M_node;
        while (__position_00._M_node = local_80._M_impl._M_node.super__List_node_base._M_next,
              iVar3._M_node != (_List_node_base *)&local_80) {
          bVar2 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::operator|
                            ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)(iVar3._M_node + 1),&local_68);
          if ((bVar2) &&
             (((ulong)(((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&polyRight->_M_next)->
                      super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl.
                      _M_node.super__List_node_base._M_next[1]._M_next &
              ~((ulong)p_Var4[1]._M_next[1]._M_next | (ulong)iVar3._M_node[2]._M_next)) != 0)) {
            if ((iVar3._M_node[1]._M_next != (_List_node_base *)local_68.field_0.var1) ||
               ((WW<8UL>)iVar3._M_node[3]._M_prev != local_68.lcm.super_WW<8UL>._words[0])) {
              psVar1 = &(this->_stat).b_criterion;
              *psVar1 = *psVar1 + 1;
              goto LAB_001428d6;
            }
            psVar1 = &(this->_stat).c_criterion;
            *psVar1 = *psVar1 + 1;
            bVar2 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRelPrime
                              ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)(iVar3._M_node + 1));
            if ((bVar2) ||
               (bVar2 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRelPrime(&local_68), !bVar2))
            goto LAB_001428d6;
            iVar3 = std::__cxx11::
                    list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                             *)&local_80,iVar3._M_node);
          }
          else {
            iVar3._M_node = (iVar3._M_node)->_M_next;
          }
        }
        while (__position_00._M_node != (_List_node_base *)&local_80) {
          bVar2 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::operator|
                            (&local_68,
                             (CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)(__position_00._M_node + 1));
          if ((bVar2) &&
             ((((_List_node_base *)local_68.field_0.var1 != __position_00._M_node[1]._M_next ||
               (local_68.lcm.super_WW<8UL>._words[0] != (WW<8UL>)__position_00._M_node[3]._M_prev))
              && (((ulong)(((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
                           &polyRight->_M_next)->
                          super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl.
                          _M_node.super__List_node_base._M_next[1]._M_next &
                  ~((ulong)p_Var4[1]._M_next[1]._M_next | (ulong)__position_00._M_node[2]._M_next))
                  != 0)))) {
            __position_00 =
                 std::__cxx11::
                 list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                 ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          *)&local_80,__position_00._M_node);
            psVar1 = &(this->_stat).b_criterion;
            *psVar1 = *psVar1 + 1;
          }
          else {
            __position_00._M_node = (__position_00._M_node)->_M_next;
          }
        }
        std::__cxx11::
        list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
        ::insert((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)&local_80,(const_iterator)__position_00._M_node,&local_68);
      } while( true );
    }
    if (pos._M_node != posPoly._M_node) {
      if (((ulong)(((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&polyRight->_M_next)->
                  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next[1]._M_next &
          ~(ulong)pos._M_node[1]._M_next[1]._M_next) == 0) {
        p_Var4 = (pos._M_node)->_M_next;
        local_68.field_0.iter1._M_node =
             (_List_node_base *)MI<8UL,_GF2::MOGrevlex<8UL>_>::Splice(&this->_reserve,iRight,pos);
        local_68.field_0.var1 = 0xffffffffffffffff;
        local_68.field_0.lm1.super_WW<8UL>._words[0] =
             (WW<8UL>)local_68.field_0.iter1._M_node[1]._M_next[1]._M_next;
        local_68.field_1.lm2.super_WW<8UL>._words[0] =
             (WW<8UL>)posPoly._M_node[1]._M_next[1]._M_next;
        local_68.lcm.super_WW<8UL>._words[0] =
             (WW<8UL>)((ulong)local_68.field_1.lm2.super_WW<8UL>._words[0] |
                      (ulong)local_68.field_0.lm1.super_WW<8UL>._words[0]);
        local_68.field_1.iter2._M_node = posPoly._M_node;
        std::__cxx11::
        list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
        ::push_front((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      *)&local_80,&local_68);
        psVar1 = &(this->_stat).r_criterion;
        *psVar1 = *psVar1 + 1;
        pos._M_node = p_Var4;
        goto LAB_001427d1;
      }
      MP<8ul,GF2::MOGrevlex<8ul>>::ModGB<GF2::MOGrevlex<8ul>>
                ((MP<8ul,GF2::MOGrevlex<8ul>> *)(pos._M_node + 1),
                 (MP<8UL,_GF2::MOGrevlex<8UL>_> *)polyRight);
    }
    pos._M_node = (pos._M_node)->_M_next;
  } while( true );
}

Assistant:

void _Update(typename _I::iterator posPoly)
	{
		// критерий A:
		// если LM(poly) | [LM(f_i), LM(f_j)] и (f_i, f_j) не является r-парой,
		// то (f_i, f_j) можно исключить
		auto posPair = _pairs.begin();
		for (; posPair != _pairs.end();)
			if ((posPoly->LM() | posPair->lcm) && !posPair->IsRPair())
				posPair = _pairs.erase(posPair), _stat.a_criterion++;
			else 
				++posPair;

		// формируем r-пары (f_i, poly), где LM(poly) | LM(f_i)
		// удаляем многочлены f_i
		// .
		// если LM(poly) \not| LM(f_i), то LM(poly) \neq LM(f_i)
		// поэтому LM(f_i mod poly) == LM(f_i) и f_i можно заменить 
		// на f_i mod poly без изменения характеристики lcm всех S-многочленов,
		// в которые входит f_i
		_CPs newpairs;
		// цикл по многочленам базиса
		_Iterator posBasis = _basis.begin();
		for (; posBasis != _basis.end();)
		{
			if (posPoly == posBasis)
			{
				++posBasis;
				continue;
			}
			// подходящий для r-пары многочлен *posBasis?
			if (posPoly->LM() | posBasis->LM())
			{
				// переводим многочлен в резерв
				_Iterator posReserve = _reserve.Splice(_basis, posBasis++);
				// добавляем новую критическую пару
				newpairs.push_front(_CP(posReserve, posPoly));
				_stat.r_criterion++;
			}
			// упрощаем *posBasis
			else posBasis->Mod(*posPoly), ++posBasis;
		}
		// добавляем r-пары в список критических пар
		newpairs.sort();
		_pairs.merge(newpairs);

		// добавляем пары (x_i^2 - x_i, poly)  
		// с учетом первого критерия Бухбергера рассматриваем только
		// такие i, что LM(poly) содержит x_i
		for (size_t var = 0; var < _n; var++)
			// есть зацепление?
			if (posPoly->LM().Test(var))
				newpairs.push_front(_CP(var, posPoly));

		// добавляем пары (f, poly), f -- явные многочлены _basis, 
		// в список пар с учетом критериев B, С:
		// если в _basis найдется f_i т.ч. 
		// [LM(f_i), LM(poly)] | [LM(f_j), LM(poly)],
		// и LM(poly) не делит [LM(f_i), LM(f_j)] или одна из пар (f_i, f_j), 
		// (f_j,f_i) уже обработана, то 
		// a) пару (f_j, poly) можно исключить, 
		//    если [LM(f_i), LM(poly)] != [LM(f_j), LM(poly)] (критерий B);
		// б) одну из пар (f_i, poly), (f_j, poly) можно исключить,
		//    если [LM(f_i), LM(poly)] == [LM(f_j), LM(poly)] (критерий С);
		// .
		// важно: f_i не может быть уравнением поля
		// важно: при применении критерия С в первую очередь исключается пара
		//		  с зацеплением
		// важно: (f_j, poly) не может быть r-парой
		for (posBasis = _basis.begin(); posBasis != _basis.end(); ++posBasis)
		{
			if (posBasis == posPoly) continue;
			// добавляемая пара
			_CP newpair(posBasis, posPoly);
			// цикл по имеющимся парам
			posPair = newpairs.begin();
			for (; posPair != newpairs.end();)
			{
				// выполняются условия делимости?
				if ((*posPair | newpair) && 
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
				{
					// новая пара исключается критерием B?
					if (*posPair != newpair)
					{
						_stat.b_criterion++;
						break;
					}
					// действует критерий C
					_stat.c_criterion++;
					// новая пара исключается критерием C?
					if (posPair->IsRelPrime() || !newpair.IsRelPrime())
						break;
					// новая пара исключает пару *posPair по критерию C
					posPair = newpairs.erase(posPair);
				}
				else
					++posPair;
			}
			// пара исключена критерием B или С? к следующей
			if (posPair != newpairs.end()) 
				continue;
			// снова цикл по имеющимся парам: пробуем их исключить
			for (posPair = newpairs.begin(); posPair != newpairs.end();)
				// критерий B исключает *posPair?
				if ((newpair | *posPair) && newpair != *posPair &&
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
						posPair = newpairs.erase(posPair), _stat.b_criterion++;
				else
					++posPair;
			// добавляем пару
			newpairs.insert(posPair, newpair);
		}
		// применяем первый критерий Бухбергера: удаляем пары без зацепления
		for (posPair = newpairs.begin(); posPair != newpairs.end();)
			if (posPair->IsRelPrime())
				_stat.buch_criterion++,
				posPair = newpairs.erase(posPair);
			else
				++posPair;
		// слияние списков пар
		newpairs.sort();
		_pairs.merge(newpairs);
	}